

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

shared_ptr<helics::Broker> helics::BrokerFactory::create(CoreType type,int argc,char **argv)

{
  int iVar1;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Broker> sVar2;
  shared_ptr<helics::Broker> sVar3;
  string_view brokerName;
  
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_register_0000003c;
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = type;
  if (create(helics::CoreType,int,char**)::emptyString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&create(helics::CoreType,int,char**)::emptyString_abi_cxx11_);
    if (iVar1 != 0) {
      create(helics::CoreType,int,char**)::emptyString_abi_cxx11_._M_dataplus._M_p =
           (pointer)&create(helics::CoreType,int,char**)::emptyString_abi_cxx11_.field_2;
      create(helics::CoreType,int,char**)::emptyString_abi_cxx11_._M_string_length = 0;
      create(helics::CoreType,int,char**)::emptyString_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &create(helics::CoreType,int,char**)::emptyString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&create(helics::CoreType,int,char**)::emptyString_abi_cxx11_);
    }
  }
  brokerName._M_len = (ulong)(uint)argc;
  brokerName._M_str =
       (char *)create(helics::CoreType,int,char**)::emptyString_abi_cxx11_._M_string_length;
  sVar2 = create(type,brokerName,
                 (int)create(helics::CoreType,int,char**)::emptyString_abi_cxx11_._M_dataplus._M_p,
                 (char **)((ulong)argv & 0xffffffff));
  sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  return (shared_ptr<helics::Broker>)
         sVar3.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> create(CoreType type, int argc, char* argv[])
{
    static const std::string emptyString;
    return create(type, emptyString, argc, argv);
}